

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O3

bool QMetaType::registerConverterFunction(ConverterFunction *f,QMetaType from,QMetaType to)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Type *this;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  QMessageLogger local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypesConversionRegistry>_>
         ::operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypesConversionRegistry>_>
                       *)f);
  uVar6 = 0;
  uVar2 = 0;
  if ((from.d_ptr != (QMetaTypeInterface *)0x0) &&
     (uVar2 = ((from.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i, uVar2 == 0)) {
    uVar2 = registerHelper(from.d_ptr);
  }
  if ((to.d_ptr != (QMetaTypeInterface *)0x0) &&
     (uVar3 = ((to.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i, uVar6 = (ulong)uVar3,
     uVar3 == 0)) {
    uVar3 = registerHelper(to.d_ptr);
    uVar6 = (ulong)uVar3;
  }
  bVar1 = QMetaTypeFunctionRegistry<std::function<bool_(const_void_*,_void_*)>,_std::pair<int,_int>_>
          ::insertIfNotContains(this,(pair<int,_int>)((ulong)uVar2 | uVar6 << 0x20),f);
  if (!bVar1) {
    local_58.context.version = 2;
    local_58.context._4_8_ = 0;
    local_58.context._12_8_ = 0;
    local_58.context.function._4_4_ = 0;
    local_58.context.category = "default";
    if (from.d_ptr == (QMetaTypeInterface *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar5 = (from.d_ptr)->name;
    }
    if (to.d_ptr == (QMetaTypeInterface *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = (to.d_ptr)->name;
    }
    QMessageLogger::warning
              (&local_58,"Type conversion already registered from type %s to type %s",pcVar5,pcVar4)
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QMetaType::registerConverterFunction(const ConverterFunction &f, QMetaType from, QMetaType to)
{
    if (!customTypesConversionRegistry()->insertIfNotContains({from.id(), to.id()}, f)) {
        qWarning("Type conversion already registered from type %s to type %s",
                 from.name(), to.name());
        return false;
    }
    return true;
}